

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O2

SeedBuilder * tcu::operator<<(SeedBuilder *builder,double value)

{
  deUint8 data [8];
  
  data = (deUint8  [8])value;
  SeedBuilder::feed(builder,8,data);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, double value)
{
	// \note Assume that double has same endianess as uint64.
	deUint64 val;

	deMemcpy(&val, &value, sizeof(deUint64));

	const deUint8	data[]	=
	{
		(deUint8)(val & 0xFFu),
		(deUint8)((val >> 8) & 0xFFu),
		(deUint8)((val >> 16) & 0xFFu),
		(deUint8)((val >> 24) & 0xFFu),

		(deUint8)((val >> 32) & 0xFFu),
		(deUint8)((val >> 40) & 0xFFu),
		(deUint8)((val >> 48) & 0xFFu),
		(deUint8)((val >> 56) & 0xFFu),
	};

	builder.feed(sizeof(data), data);
	return builder;
}